

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O1

byte_vec_t * sfc::pack_native_mapentry(byte_vec_t *__return_storage_ptr__,Mapentry *entry,Mode mode)

{
  uchar local_11;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(mode) {
  case snes:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case snes_mode7:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case gb:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case gbc:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case gba:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case gba_affine:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case md:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case pce:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case ws:
  case wsc:
  case wsc_packed:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case ngp:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case ngpc:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    break;
  case sms:
  case gg:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

inline byte_vec_t pack_native_mapentry(const Mapentry& entry, Mode mode) {
  byte_vec_t v;
  switch (mode) {
  case Mode::snes:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x03) | ((entry.palette_index << 2) & 0x1c) | (entry.flip_h << 6) | (entry.flip_v << 7));
    break;

  case Mode::snes_mode7:
    v.push_back(entry.tile_index & 0xff);
    break;

  case Mode::gb:
    v.push_back(entry.tile_index & 0xff);
    break;

  case Mode::sms:
  case Mode::gg:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | (entry.flip_h << 1) | (entry.flip_v << 2) | ((entry.palette_index << 3) & 0x8));
    // SMS and GG support depth information per tile in tilemap, instead of per sprite. But superfamiconv doesn't provide that rope?
    break;

  case Mode::gbc:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.palette_index) & 0x07) | ((entry.tile_index >> 5) & 0x08) | (entry.flip_h << 5) | (entry.flip_v << 6));
    break;

  case Mode::gba:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x03) | (entry.flip_h << 2) | (entry.flip_v << 3) | ((entry.palette_index << 4) & 0xf0));
    break;

  case Mode::gba_affine:
    v.push_back(entry.tile_index & 0xff);
    break;

  case Mode::md:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x07) | (entry.flip_h << 3) | (entry.flip_v << 4) | ((entry.palette_index << 5) & 0x60));
    break;

  case Mode::pce:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x0f) | ((entry.palette_index << 4) & 0xf0));
    break;

  case Mode::ws:
  case Mode::wsc:
  case Mode::wsc_packed:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | ((entry.palette_index << 1) & 0x1e) | ((entry.tile_index >> 4) & 0x20) | (entry.flip_h << 6) | (entry.flip_v << 7));
    break;

  case Mode::ngp:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | ((entry.palette_index << 5) & 0x20) | (entry.flip_v << 6) | (entry.flip_h << 7));
    break;

  case Mode::ngpc:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | ((entry.palette_index << 1) & 0x1e) | (entry.flip_v << 6) | (entry.flip_h << 7));
    break;

  case Mode::pce_sprite:
  case Mode::none:
    break;
  }
  return v;
}